

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O3

char * mi_heap_realpath(mi_heap_t *heap,char *fname,char *resolved_name)

{
  char *pcVar1;
  char *pcVar2;
  
  if (resolved_name != (char *)0x0) {
    pcVar1 = realpath(fname,resolved_name);
    return pcVar1;
  }
  pcVar1 = realpath(fname,(char *)0x0);
  if (pcVar1 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = mi_heap_strdup(heap,pcVar1);
    mi_cfree(pcVar1);
  }
  return pcVar2;
}

Assistant:

char* mi_heap_realpath(mi_heap_t* heap, const char* fname, char* resolved_name) mi_attr_noexcept {
  if (resolved_name != NULL) {
    return realpath(fname,resolved_name);
  }
  else {
    char* rname = realpath(fname, NULL);
    if (rname == NULL) return NULL;
    char* result = mi_heap_strdup(heap, rname);
    mi_cfree(rname);  // use checked free (which may be redirected to our free but that's ok)
    // note: with ASAN realpath is intercepted and mi_cfree may leak the returned pointer :-(
    return result;
  }
  /*
    const size_t n  = mi_path_max();
    char* buf = (char*)mi_malloc(n+1);
    if (buf == NULL) {
      errno = ENOMEM;
      return NULL;
    }
    char* rname  = realpath(fname,buf);
    char* result = mi_heap_strndup(heap,rname,n); // ok if `rname==NULL`
    mi_free(buf);
    return result;
  }
  */
}